

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Entry * __thiscall
kj::
Table<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry,_kj::HashIndex<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Callbacks>_>
::insert(Table<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry,_kj::HashIndex<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Callbacks>_>
         *this,Entry *row)

{
  Entry *pEVar1;
  Impl<0UL,_false> local_28 [16];
  
  Impl<0UL,_false>::insert
            (local_28,(Table<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry,_kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Callbacks>_>
                       *)this,(*(long *)(this + 8) - *(long *)this) / 0x28,row,0xffffffff);
  if (local_28[0] != (Impl<0UL,_false>)0x1) {
    pEVar1 = Vector<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Entry>::
             add<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Entry>
                       ((Vector<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Entry>
                         *)this,row);
    return pEVar1;
  }
  _::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  if (kj::none != Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }
}